

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

CBString * Bstrlib::operator+(CBString *__return_storage_ptr__,char c,CBString *b)

{
  CBString local_30;
  
  CBString::CBString(&local_30,c);
  CBString::operator+(__return_storage_ptr__,&local_30,b);
  if (local_30.super_tagbstring.data != (uchar *)0x0) {
    free(local_30.super_tagbstring.data);
  }
  return __return_storage_ptr__;
}

Assistant:

const CBString operator + (char c, const CBString& b) {
	return CBString(c) + b;
}